

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O2

void test_extract_ctx(void)

{
  undefined8 uVar1;
  bson_t *bson;
  char *pcVar2;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar4;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 uVar5;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar6;
  int32_t c;
  int32_t b;
  int32_t a;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  uVar1 = bson_bcon_magic();
  bson = (bson_t *)
         bcon_new(0,"a",uVar1,0xf,1,"b",uVar1,CONCAT44(uVar3,0xf),CONCAT44(uVar4,2),"c",uVar1,
                  CONCAT44(uVar5,0xf),CONCAT44(uVar6,3),0);
  uVar1 = bson_bcone_magic();
  test_extract_ctx_helper(bson,3,"a",uVar1,0xf,&a,0,"b",uVar1,0xf,&b,0,"c",uVar1,0xf,&c,0);
  if (a == 1) {
    if (b == 2) {
      if (c == 3) {
        bson_destroy(bson);
        return;
      }
      pcVar2 = "c == 3";
      uVar1 = 0x199;
    }
    else {
      pcVar2 = "b == 2";
      uVar1 = 0x198;
    }
  }
  else {
    pcVar2 = "a == 1";
    uVar1 = 0x197;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar1,"test_extract_ctx",pcVar2);
  abort();
}

Assistant:

static void
test_extract_ctx (void)
{
   int32_t a, b, c;

   bson_t *bson =
      BCON_NEW ("a", BCON_INT32 (1), "b", BCON_INT32 (2), "c", BCON_INT32 (3));

   test_extract_ctx_helper (bson,
                            3,
                            "a",
                            BCONE_INT32 (a),
                            NULL,
                            "b",
                            BCONE_INT32 (b),
                            NULL,
                            "c",
                            BCONE_INT32 (c),
                            NULL);

   BSON_ASSERT (a == 1);
   BSON_ASSERT (b == 2);
   BSON_ASSERT (c == 3);

   bson_destroy (bson);
}